

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageBufferVariable(Instruction *this)

{
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  
  if (this->opcode_ == OpVariable) {
    uVar2 = GetSingleWordInOperand(this,0);
    if ((uVar2 == 0xc) || (uVar2 == 2)) {
      this_00 = IRContext::get_def_use_mgr(this->context_);
      uVar2 = type_id(this);
      this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
      if (this_01 != (Instruction *)0x0) {
        bVar1 = IsVulkanStorageBuffer(this_01);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanStorageBufferVariable() const {
  if (opcode() != spv::Op::OpVariable) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kVariableStorageClassIndex));
  if (storage_class == spv::StorageClass::StorageBuffer ||
      storage_class == spv::StorageClass::Uniform) {
    Instruction* var_type = context()->get_def_use_mgr()->GetDef(type_id());
    return var_type != nullptr && var_type->IsVulkanStorageBuffer();
  }

  return false;
}